

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

bool anon_unknown.dwarf_522f::remove_file_or_directory(path *p,file_type type,error_code *ec)

{
  bool bVar1;
  int *piVar2;
  err_t local_30;
  err_t local_2c;
  error_code *ec_local;
  file_type type_local;
  path *p_local;
  
  if (type == file_not_found) {
    if (ec != (error_code *)0x0) {
      boost::system::error_code::clear(ec);
    }
    p_local._7_1_ = false;
  }
  else {
    if (type == directory_file) {
      bVar1 = remove_directory(p);
      if (bVar1) {
        local_2c = 0;
      }
      else {
        piVar2 = __errno_location();
        local_2c = *piVar2;
      }
      bVar1 = error(local_2c,p,ec,"boost::filesystem::remove");
      if (bVar1) {
        return false;
      }
    }
    else {
      bVar1 = remove_file(p);
      if (bVar1) {
        local_30 = 0;
      }
      else {
        piVar2 = __errno_location();
        local_30 = *piVar2;
      }
      bVar1 = error(local_30,p,ec,"boost::filesystem::remove");
      if (bVar1) {
        return false;
      }
    }
    p_local._7_1_ = true;
  }
  return p_local._7_1_;
}

Assistant:

bool remove_file_or_directory(const path& p, fs::file_type type, error_code* ec)
    // return true if file removed, false if not removed
  {
    if (type == fs::file_not_found)
    {
      if (ec != 0) ec->clear();
      return false;
    }

    if (type == fs::directory_file
#     ifdef BOOST_WINDOWS_API
        || type == fs::_detail_directory_symlink
#     endif
      )
    {
      if (error(!remove_directory(p) ? BOOST_ERRNO : 0, p, ec,
        "boost::filesystem::remove"))
          return false;
    }
    else
    {
      if (error(!remove_file(p) ? BOOST_ERRNO : 0, p, ec,
        "boost::filesystem::remove"))
          return false;
    }
    return true;
  }